

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::exception_message(binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                    *this,input_format_t format,string *detail,string *context)

{
  undefined4 in_EDX;
  string *in_RDI;
  string error_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  allocator<char> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  switch(in_EDX) {
  case 0:
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp"
               ,0x2f39,"GGML_ASSERT(%s) failed","false");
    break;
  case 1:
    std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb8,"CBOR");
    break;
  case 2:
    std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb8,"MessagePack");
    break;
  case 3:
    std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb8,"UBJSON");
    break;
  case 4:
    std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb8,"BSON");
    break;
  case 5:
    std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffb8,"BJData");
  }
  concat<std::__cxx11::string,std::__cxx11::string&,char,std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string_const&>
            (in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (char (*) [3])in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  return in_RDI;
}

Assistant:

std::string exception_message(const input_format_t format,
                                  const std::string& detail,
                                  const std::string& context) const
    {
        std::string error_msg = "syntax error while parsing ";

        switch (format)
        {
            case input_format_t::cbor:
                error_msg += "CBOR";
                break;

            case input_format_t::msgpack:
                error_msg += "MessagePack";
                break;

            case input_format_t::ubjson:
                error_msg += "UBJSON";
                break;

            case input_format_t::bson:
                error_msg += "BSON";
                break;

            case input_format_t::bjdata:
                error_msg += "BJData";
                break;

            case input_format_t::json: // LCOV_EXCL_LINE
            default:            // LCOV_EXCL_LINE
                JSON_ASSERT(false); // NOLINT(cert-dcl03-c,hicpp-static-assert,misc-static-assert) LCOV_EXCL_LINE
        }

        return concat(error_msg, ' ', context, ": ", detail);
    }